

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDFloat32x4Operation::OpReciprocalSqrt(SIMDValue *value)

{
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar1;
  undefined1 auVar2 [16];
  
  auVar2 = divps(_DAT_0111d510,(undefined1  [16])value->field_0);
  aVar1.i32 = (Type  [4])sqrtps(value->field_0,auVar2);
  return (SIMDValue)aVar1;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpReciprocalSqrt(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue temp;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        temp.m128_value = _mm_div_ps(X86_ALL_ONES_F4.m128_value, v.m128_value); // temp = 1.0/value
        x86Result.m128_value = _mm_sqrt_ps(temp.m128_value);              // result = sqrt(1.0/value)

        return X86SIMDValue::ToSIMDValue(x86Result);
    }